

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::InitialLabelCase::iterate(InitialLabelCase *this)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  bool bVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 extraout_var;
  undefined8 uVar7;
  NotSupportedError *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  allocator<char> local_2d5;
  int outlen;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  ScopedLogSection section;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  string local_268;
  code *local_248;
  int local_240;
  ResultCollector result;
  undefined1 local_1e8 [384];
  char buffer [64];
  long lVar6;
  
  bVar3 = isKHRDebugSupported((this->super_TestCase).m_context);
  if (!bVar3) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"GL_KHR_debug is not supported","isKHRDebugSupported(m_context)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDebugTests.cpp"
               ,0x758);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar4);
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1e8," // ERROR: ",(allocator<char> *)buffer);
  tcu::ResultCollector::ResultCollector(&result,pTVar2,(string *)local_1e8);
  std::__cxx11::string::~string((string *)local_1e8);
  outlen = -1;
  uVar7 = (**(code **)(lVar6 + 0x640))(0x9117,0);
  iVar4 = (**(code **)(lVar6 + 0x800))();
  if (iVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a8,"Got Error ",(allocator<char> *)&section);
    local_248 = glu::getErrorName;
    local_240 = iVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_268,&local_248);
    std::operator+(&local_288,&local_2a8,&local_268);
    std::operator+(&local_2d0,&local_288,": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8,
                   &local_2d0,"fenceSync");
    tcu::ResultCollector::fail(&result,(string *)local_1e8);
    std::__cxx11::string::~string((string *)local_1e8);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_2a8);
  }
  uVar5 = (**(code **)(lVar6 + 0x3f0))(0x8b30);
  iVar4 = (**(code **)(lVar6 + 0x800))();
  if (iVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a8,"Got Error ",(allocator<char> *)&section);
    local_248 = glu::getErrorName;
    local_240 = iVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_268,&local_248);
    std::operator+(&local_288,&local_2a8,&local_268);
    std::operator+(&local_2d0,&local_288,": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8,
                   &local_2d0,"createShader");
    tcu::ResultCollector::fail(&result,(string *)local_1e8);
    std::__cxx11::string::~string((string *)local_1e8);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_2a8);
  }
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1e8,"Shader",(allocator<char> *)&local_288);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d0,"Shader object",(allocator<char> *)&local_2a8);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar2,(string *)local_1e8,&local_2d0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)local_1e8);
  local_1e8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1e8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Querying initial value");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  buffer[0] = 'X';
  outlen = -1;
  (**(code **)(lVar6 + 0x958))(0x82e1,uVar5,0x40);
  iVar4 = (**(code **)(lVar6 + 0x800))();
  if (iVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"Got Error ",&local_2d5)
    ;
    local_248 = glu::getErrorName;
    local_240 = iVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_268,&local_248);
    std::operator+(&local_288,&local_2a8,&local_268);
    std::operator+(&local_2d0,&local_288,": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8,
                   &local_2d0,"getObjectLabel");
    tcu::ResultCollector::fail(&result,(string *)local_1e8);
    std::__cxx11::string::~string((string *)local_1e8);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_2a8);
  }
  if (outlen == 0) {
    if (buffer[0] != '\0') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1e8,"label was not null terminated",(allocator<char> *)&local_2d0);
      tcu::ResultCollector::fail(&result,(string *)local_1e8);
      pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8;
      goto LAB_011ce9cb;
    }
    local_1e8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1e8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Got 0-sized null-terminated string.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  else {
    de::toString<int>(&local_2d0,&outlen);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8,
                   "\'length\' was not zero, got ",&local_2d0);
    tcu::ResultCollector::fail(&result,(string *)local_1e8);
    std::__cxx11::string::~string((string *)local_1e8);
    pbVar8 = &local_2d0;
LAB_011ce9cb:
    std::__cxx11::string::~string((string *)pbVar8);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1e8,"Sync",(allocator<char> *)&local_288);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d0,"Sync object",(allocator<char> *)&local_2a8);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar2,(string *)local_1e8,&local_2d0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)local_1e8);
  local_1e8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1e8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Querying initial value");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  buffer[0] = 'X';
  outlen = -1;
  (**(code **)(lVar6 + 0x960))(uVar7,0x40);
  iVar4 = (**(code **)(lVar6 + 0x800))();
  if (iVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"Got Error ",&local_2d5)
    ;
    local_248 = glu::getErrorName;
    local_240 = iVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_268,&local_248);
    std::operator+(&local_288,&local_2a8,&local_268);
    std::operator+(&local_2d0,&local_288,": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8,
                   &local_2d0,"getObjectPtrLabel");
    tcu::ResultCollector::fail(&result,(string *)local_1e8);
    std::__cxx11::string::~string((string *)local_1e8);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_2a8);
  }
  if (outlen == 0) {
    if (buffer[0] == '\0') {
      local_1e8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1e8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Got 0-sized null-terminated string.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      goto LAB_011cec22;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1e8,"label was not null terminated",(allocator<char> *)&local_2d0);
    tcu::ResultCollector::fail(&result,(string *)local_1e8);
    pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8;
  }
  else {
    de::toString<int>(&local_2d0,&outlen);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8,
                   "\'length\' was not zero, got ",&local_2d0);
    tcu::ResultCollector::fail(&result,(string *)local_1e8);
    std::__cxx11::string::~string((string *)local_1e8);
    pbVar8 = &local_2d0;
  }
  std::__cxx11::string::~string((string *)pbVar8);
LAB_011cec22:
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  (**(code **)(lVar6 + 0x470))(uVar5);
  (**(code **)(lVar6 + 0x478))(uVar7);
  tcu::ResultCollector::setTestContextResult
            (&result,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::ResultCollector::~ResultCollector(&result);
  return STOP;
}

Assistant:

InitialLabelCase::IterateResult InitialLabelCase::iterate (void)
{
	TCU_CHECK_AND_THROW(NotSupportedError, isKHRDebugSupported(m_context), "GL_KHR_debug is not supported");

	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	tcu::ResultCollector	result		(m_testCtx.getLog(), " // ERROR: ");
	int						outlen		= -1;
	GLuint					shader;
	glw::GLsync				sync;
	char					buffer[64];

	sync = gl.fenceSync(GL_SYNC_GPU_COMMANDS_COMPLETE, 0);
	GLS_COLLECT_GL_ERROR(result, gl.getError(), "fenceSync");

	shader = gl.createShader(GL_FRAGMENT_SHADER);
	GLS_COLLECT_GL_ERROR(result, gl.getError(), "createShader");

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Shader", "Shader object");
		m_testCtx.getLog() << TestLog::Message << "Querying initial value" << TestLog::EndMessage;

		buffer[0] = 'X';
		outlen = -1;
		gl.getObjectLabel(GL_SHADER, shader, sizeof(buffer), &outlen, buffer);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectLabel");

		if (outlen != 0)
			result.fail("'length' was not zero, got " + de::toString(outlen));
		else if (buffer[0] != '\0')
			result.fail("label was not null terminated");
		else
			m_testCtx.getLog() << TestLog::Message << "Got 0-sized null-terminated string." << TestLog::EndMessage;
	}

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Sync", "Sync object");
		m_testCtx.getLog() << TestLog::Message << "Querying initial value" << TestLog::EndMessage;

		buffer[0] = 'X';
		outlen = -1;
		gl.getObjectPtrLabel(sync, sizeof(buffer), &outlen, buffer);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectPtrLabel");

		if (outlen != 0)
			result.fail("'length' was not zero, got " + de::toString(outlen));
		else if (buffer[0] != '\0')
			result.fail("label was not null terminated");
		else
			m_testCtx.getLog() << TestLog::Message << "Got 0-sized null-terminated string." << TestLog::EndMessage;
	}

	gl.deleteShader(shader);
	gl.deleteSync(sync);

	result.setTestContextResult(m_testCtx);
	return STOP;
}